

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

bool chrono::utils::AddTriangleMeshGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,string *obj_filename,
               string *name,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  double *pdVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  ChTriangleMeshShape *this;
  long lVar16;
  ChBody *model;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  undefined1 local_158 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  shared_ptr<chrono::ChVisualShape> local_138;
  shared_ptr<chrono::ChVisualMaterial> local_128;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_118;
  element_type *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  ChVisualModel *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  ChQuaternion<double> local_d8;
  undefined1 local_b8 [56];
  pointer piStack_80;
  ChMatrix33<double> local_78;
  
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_158,obj_filename,false,false);
  uVar12 = local_158._0_8_;
  if ((_func_int **)local_158._0_8_ != (_func_int **)0x0) {
    lVar16 = (long)*(_func_int **)(local_158._0_8_ + 0x10) -
             (long)*(_func_int **)(local_158._0_8_ + 8);
    if (lVar16 != 0) {
      auVar17 = ZEXT816(0xbff0000000000000);
      auVar18 = ZEXT816(0x4000000000000000);
      lVar16 = (lVar16 >> 3) * -0x5555555555555555;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      pdVar14 = (double *)(*(_func_int **)(local_158._0_8_ + 8) + 0x10);
      do {
        dVar1 = rot->m_data[0];
        dVar2 = rot->m_data[2];
        dVar3 = rot->m_data[1];
        dVar4 = rot->m_data[3];
        dVar5 = pdVar14[-1];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = pdVar14[-2];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *pdVar14;
        dVar9 = dVar1 * dVar1;
        dVar10 = dVar3 * dVar2 - dVar4 * dVar1;
        dVar8 = dVar3 * dVar2 + dVar4 * dVar1;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar9 + dVar2 * dVar2;
        auVar24 = vfmadd213sd_fma(auVar26,auVar18,auVar17);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar9 + dVar3 * dVar3;
        auVar20 = vfmadd213sd_fma(auVar23,auVar18,auVar17);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar5 * (dVar10 + dVar10);
        auVar20 = vfmadd231sd_fma(auVar28,auVar29,auVar20);
        dVar10 = dVar1 * dVar2 + dVar4 * dVar3;
        dVar11 = dVar4 * dVar3 - dVar1 * dVar2;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar8 + dVar8;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar5 * auVar24._0_8_;
        auVar19 = vfmadd231sd_fma(auVar27,auVar29,auVar19);
        dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
        dVar2 = dVar1 * dVar3 + dVar4 * dVar2;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar10 + dVar10;
        auVar24 = vfmadd213sd_fma(auVar24,auVar30,auVar20);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar8 + dVar8;
        auVar20 = vfmadd213sd_fma(auVar20,auVar30,auVar19);
        dVar1 = pos->m_data[1];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar11 + dVar11;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar5 * (dVar2 + dVar2);
        auVar21 = vfmadd231sd_fma(auVar25,auVar29,auVar21);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar4 * dVar4 + dVar9;
        auVar19 = vfmadd213sd_fma(auVar22,auVar18,auVar17);
        auVar19 = vfmadd213sd_fma(auVar19,auVar30,auVar21);
        dVar2 = pos->m_data[2];
        pdVar14[-2] = auVar24._0_8_ + pos->m_data[0];
        pdVar14[-1] = auVar20._0_8_ + dVar1;
        *pdVar14 = auVar19._0_8_ + dVar2;
        pdVar14 = pdVar14 + 3;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    peVar6 = (body->collision_model).
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var15 = (body->collision_model).
              super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      }
    }
    local_f8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
    p_Stack_f0 = (material->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
    p_Var7 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    local_108 = (element_type *)local_158._0_8_;
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
      }
    }
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = SUB168(ZEXT816(0),4);
    local_d8.m_data[2] = 0.0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._40_16_ = SUB3216(ZEXT832(0),4);
    piStack_80 = (pointer)0x0;
    local_b8._16_8_ = SUB328(ZEXT832(0),4);
    local_b8._24_8_ = (pointer)0x0;
    local_b8._0_8_ = (pointer)0x3ff0000000000000;
    local_b8._32_8_ = (pointer)0x3ff0000000000000;
    local_78.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (*peVar6->_vptr_ChCollisionModel[0x10])(peVar6,&local_f8,&local_108,0,0,&local_d8,local_b8);
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
    }
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    if (visualization) {
      model = body;
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      uVar13 = local_b8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      if ((pointer)uVar13 == (pointer)0x0) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
        p_Var15->_M_use_count = 1;
        p_Var15->_M_weak_count = 1;
        local_158._16_8_ = p_Var15 + 1;
        p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
        p_Var15[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[1]._M_use_count = 0;
        p_Var15[1]._M_weak_count = 0;
        p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[2]._M_use_count = 0;
        p_Var15[2]._M_weak_count = 0;
        p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[2]._M_use_count = 0;
        p_Var15[2]._M_weak_count = 0;
        p_Var15[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var15[3]._M_use_count = 0;
        p_Var15[3]._M_weak_count = 0;
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = 2;
        }
        model = (ChBody *)(local_158 + 0x10);
        local_140 = p_Var15;
        ChPhysicsItem::AddVisualModel
                  (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
        if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      this = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model)
      ;
      ChTriangleMeshShape::ChTriangleMeshShape(this);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
                (&_Stack_160,this);
      local_118.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_158._0_8_;
      local_118.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_158._8_8_ + 8) = *(_Atomic_word *)(local_158._8_8_ + 8) + 1;
        }
      }
      ChTriangleMeshShape::SetMesh(this,&local_118,true);
      if (local_118.
          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)&this->name);
      local_128.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_128.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (vis_material->
               super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      p_Var15 = (vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      ChVisualShape::AddMaterial((ChVisualShape *)this,&local_128);
      if (local_128.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.
                   super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
      local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_160._M_pi;
      if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_160._M_pi)->_M_use_count = (_Stack_160._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_160._M_pi)->_M_use_count = (_Stack_160._M_pi)->_M_use_count + 1;
        }
      }
      local_b8._40_16_ = ZEXT816(0) << 0x20;
      local_d8.m_data[0] = 1.0;
      local_d8.m_data[1] = 0.0;
      local_d8.m_data[2] = SUB168(ZEXT816(0),4);
      local_d8.m_data[3] = 0.0;
      local_b8._0_8_ = &PTR__ChFrame_00b03780;
      local_b8._24_8_ = (pointer)0x0;
      local_b8._32_8_ = (pointer)0x3ff0000000000000;
      piStack_80 = (pointer)0x0;
      local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      local_b8._8_8_ = local_d8.m_data[1];
      local_b8._16_8_ = local_d8.m_data[2];
      ChMatrix33<double>::ChMatrix33(&local_78,&local_d8);
      ChVisualModel::AddShape(local_e8,&local_138,(ChFrame<double> *)local_b8);
      if (local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  return (_func_int **)uVar12 != (_func_int **)0x0;
}

Assistant:

bool AddTriangleMeshGeometry(ChBody* body,
                             std::shared_ptr<ChMaterialSurface> material,
                             const std::string& obj_filename,
                             const std::string& name,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             bool visualization,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(obj_filename, false, false);
    if (!trimesh)
        return false;

    for (int i = 0; i < trimesh->m_vertices.size(); i++)
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);

    body->GetCollisionModel()->AddTriangleMesh(material, trimesh, false, false);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }

    return true;
}